

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size_max,uint32_t alphabet_size_limit,HuffmanCode *table,
               uint32_t *opt_table_size,BrotliDecoderStateInternal *s)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  BrotliDecoderErrorCode BVar10;
  BrotliRunningState BVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  BrotliDecoderErrorCode local_1ac;
  BrotliDecoderErrorCode result_2;
  uint32_t table_size_1;
  BrotliDecoderErrorCode result_1;
  uint32_t i;
  uint32_t bits;
  uint32_t table_size;
  BrotliDecoderErrorCode result;
  BrotliMetablockHeaderArena *h;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  uint32_t *opt_table_size_local;
  HuffmanCode *table_local;
  uint32_t local_160;
  uint32_t alphabet_size_limit_local;
  uint32_t alphabet_size_max_local;
  undefined4 local_14c;
  BrotliMetablockHeaderArena *local_148;
  int local_13c;
  uint32_t *local_138;
  undefined4 local_12c;
  BrotliMetablockHeaderArena *local_128;
  int local_11c;
  uint32_t *local_118;
  undefined4 local_10c;
  BrotliMetablockHeaderArena *local_108;
  int local_fc;
  BrotliMetablockHeaderArena *local_f8;
  BrotliMetablockHeaderArena *local_f0;
  BrotliMetablockHeaderArena *local_e8;
  uint32_t *local_e0;
  undefined4 local_d4;
  BrotliMetablockHeaderArena *local_d0;
  undefined4 local_c8;
  uint32_t local_c4;
  uint32_t *local_c0;
  undefined4 local_b4;
  BrotliMetablockHeaderArena *local_b0;
  undefined4 local_a8;
  uint32_t local_a4;
  BrotliDecoderErrorCode *local_a0;
  undefined4 local_94;
  BrotliMetablockHeaderArena *local_90;
  undefined4 local_88;
  uint32_t local_84;
  BrotliMetablockHeaderArena *local_80;
  BrotliMetablockHeaderArena *local_78;
  BrotliMetablockHeaderArena *local_70;
  undefined4 local_64;
  BrotliMetablockHeaderArena *local_60;
  undefined4 local_54;
  BrotliMetablockHeaderArena *local_50;
  undefined4 local_44;
  BrotliMetablockHeaderArena *local_40;
  BrotliMetablockHeaderArena *local_38;
  uint local_2c;
  BrotliMetablockHeaderArena *local_28;
  uint local_1c;
  BrotliMetablockHeaderArena *local_18;
  uint local_c;
  
  h = (BrotliMetablockHeaderArena *)&s->br;
  _table_size = &s->arena;
  br = (BrotliBitReader *)s;
  s_local = (BrotliDecoderStateInternal *)opt_table_size;
  opt_table_size_local = (uint32_t *)table;
  table_local._4_4_ = alphabet_size_limit;
  local_160 = alphabet_size_max;
  do {
    switch((_table_size->header).substate_huffman) {
    case BROTLI_STATE_HUFFMAN_NONE:
      local_118 = &(_table_size->header).sub_loop_counter;
      local_108 = h;
      local_10c = 2;
      do {
        local_f8 = h;
        if (1 < 0x40 - h->substate_huffman) {
          local_d0 = h;
          local_d4 = 2;
          local_70 = h;
          uVar3._0_4_ = h->substate_tree_group;
          uVar3._4_4_ = h->substate_context_map;
          local_c8 = 2;
          local_c4 = 3;
          *local_118 = (uint)(uVar3 >> ((byte)h->substate_huffman & 0x3f)) & 3;
          local_40 = h;
          local_44 = 2;
          h->substate_huffman = h->substate_huffman + BROTLI_STATE_HUFFMAN_SIMPLE_READ;
          local_fc = 1;
          local_e0 = local_118;
          goto LAB_001b526b;
        }
        local_38 = h;
        lVar1._0_4_ = h->symbol;
        lVar1._4_4_ = h->repeat;
        if (lVar1 != 0) {
          uVar2._0_4_ = h->substate_tree_group;
          uVar2._4_4_ = h->substate_context_map;
          h->substate_tree_group = (int)(uVar2 >> 8);
          h->substate_context_map = (int)((uVar2 >> 8) >> 0x20);
          uVar12._0_4_ = h->substate_tree_group;
          uVar12._4_4_ = h->substate_context_map;
          uVar12 = (ulong)**(byte **)&h->repeat_code_len << 0x38 | uVar12;
          h->substate_tree_group = (int)uVar12;
          h->substate_context_map = (int)(uVar12 >> 0x20);
          h->substate_huffman = h->substate_huffman - 8;
          *(long *)&h->symbol = *(long *)&h->symbol + -1;
          *(long *)&h->repeat_code_len = *(long *)&h->repeat_code_len + 1;
        }
        local_2c = (uint)(lVar1 != 0);
      } while (local_2c != 0);
      local_fc = 0;
LAB_001b526b:
      if (local_fc == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((_table_size->header).sub_loop_counter == 1) goto switchD_001b50d2_caseD_1;
      (_table_size->header).space = 0x20;
      (_table_size->header).repeat = 0;
      memset((void *)((long)_table_size + 0x6e2),0,0xc);
      memset((void *)((long)_table_size + 0x6d0),0,0x12);
      (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      break;
    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      goto switchD_001b50d2_caseD_1;
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
      goto switchD_001b50d2_caseD_2;
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
      goto switchD_001b50d2_caseD_3;
    case BROTLI_STATE_HUFFMAN_COMPLEX:
      BVar10 = ReadCodeLengthCodeLengths((BrotliDecoderStateInternal *)br);
      if (BVar10 != BROTLI_DECODER_SUCCESS) {
        return BVar10;
      }
      BrotliBuildCodeLengthsHuffmanTable
                ((_table_size->header).table,(_table_size->header).code_length_code_lengths,
                 (_table_size->header).code_length_histo);
      memset((void *)((long)_table_size + 0x6e2),0,0x20);
      for (table_size_1 = 0; table_size_1 < 0x10; table_size_1 = table_size_1 + 1) {
        *(uint32_t *)((long)_table_size + (ulong)table_size_1 * 4 + 0x650) = table_size_1 - 0x10;
        (_table_size->header).symbol_lists
        [*(int *)((long)_table_size + (ulong)table_size_1 * 4 + 0x650)] = 0xffff;
      }
      (_table_size->header).symbol = 0;
      (_table_size->header).prev_code_len = 8;
      (_table_size->header).repeat = 0;
      (_table_size->header).repeat_code_len = 0;
      (_table_size->header).space = 0x8000;
      (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
      goto switchD_001b50d2_caseD_5;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
switchD_001b50d2_caseD_5:
  local_1ac = ReadSymbolCodeLengths(table_local._4_4_,(BrotliDecoderStateInternal *)br);
  if (local_1ac == BROTLI_DECODER_NEEDS_MORE_INPUT) {
    local_1ac = SafeReadSymbolCodeLengths(table_local._4_4_,(BrotliDecoderStateInternal *)br);
  }
  if (local_1ac != BROTLI_DECODER_SUCCESS) {
    return local_1ac;
  }
  if ((_table_size->header).space != 0) {
    return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
  }
  BVar11 = BrotliBuildHuffmanTable
                     ((HuffmanCode *)opt_table_size_local,8,(_table_size->header).symbol_lists,
                      (_table_size->header).code_length_histo);
  if (s_local != (BrotliDecoderStateInternal *)0x0) {
    s_local->state = BVar11;
  }
  (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
  return BROTLI_DECODER_SUCCESS;
switchD_001b50d2_caseD_1:
  local_138 = &(_table_size->header).symbol;
  local_128 = h;
  local_12c = 2;
  do {
    local_f0 = h;
    if (1 < 0x40 - h->substate_huffman) {
      local_b0 = h;
      local_b4 = 2;
      local_78 = h;
      uVar6._0_4_ = h->substate_tree_group;
      uVar6._4_4_ = h->substate_context_map;
      local_a8 = 2;
      local_a4 = 3;
      *local_138 = (uint)(uVar6 >> ((byte)h->substate_huffman & 0x3f)) & 3;
      local_50 = h;
      local_54 = 2;
      h->substate_huffman = h->substate_huffman + BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      local_11c = 1;
      local_c0 = local_138;
      goto LAB_001b548c;
    }
    local_28 = h;
    lVar4._0_4_ = h->symbol;
    lVar4._4_4_ = h->repeat;
    if (lVar4 != 0) {
      uVar5._0_4_ = h->substate_tree_group;
      uVar5._4_4_ = h->substate_context_map;
      h->substate_tree_group = (int)(uVar5 >> 8);
      h->substate_context_map = (int)((uVar5 >> 8) >> 0x20);
      uVar13._0_4_ = h->substate_tree_group;
      uVar13._4_4_ = h->substate_context_map;
      uVar13 = (ulong)**(byte **)&h->repeat_code_len << 0x38 | uVar13;
      h->substate_tree_group = (int)uVar13;
      h->substate_context_map = (int)(uVar13 >> 0x20);
      h->substate_huffman = h->substate_huffman - 8;
      *(long *)&h->symbol = *(long *)&h->symbol + -1;
      *(long *)&h->repeat_code_len = *(long *)&h->repeat_code_len + 1;
    }
    local_1c = (uint)(lVar4 != 0);
  } while (local_1c != 0);
  local_11c = 0;
LAB_001b548c:
  if (local_11c == 0) {
    (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
    alphabet_size_limit_local = 2;
  }
  else {
    (_table_size->header).sub_loop_counter = 0;
switchD_001b50d2_caseD_2:
    alphabet_size_limit_local =
         ReadSimpleHuffmanSymbols(local_160,table_local._4_4_,(BrotliDecoderStateInternal *)br);
    if (alphabet_size_limit_local == BROTLI_DECODER_SUCCESS) {
      bits = 1;
switchD_001b50d2_caseD_3:
      if ((_table_size->header).symbol == 3) {
        local_148 = h;
        local_14c = 1;
        _alphabet_size_max_local = &result_1;
        do {
          local_e8 = h;
          if (h->substate_huffman != 0x40) {
            local_90 = h;
            local_94 = 1;
            local_80 = h;
            uVar9._0_4_ = h->substate_tree_group;
            uVar9._4_4_ = h->substate_context_map;
            local_88 = 1;
            local_84 = 1;
            result_1 = (BrotliDecoderErrorCode)(uVar9 >> ((byte)h->substate_huffman & 0x3f)) & 1;
            local_60 = h;
            local_64 = 1;
            h->substate_huffman = h->substate_huffman + BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
            local_13c = 1;
            local_a0 = _alphabet_size_max_local;
            goto LAB_001b5692;
          }
          local_18 = h;
          lVar7._0_4_ = h->symbol;
          lVar7._4_4_ = h->repeat;
          if (lVar7 != 0) {
            uVar8._0_4_ = h->substate_tree_group;
            uVar8._4_4_ = h->substate_context_map;
            h->substate_tree_group = (int)(uVar8 >> 8);
            h->substate_context_map = (int)((uVar8 >> 8) >> 0x20);
            uVar14._0_4_ = h->substate_tree_group;
            uVar14._4_4_ = h->substate_context_map;
            uVar14 = (ulong)**(byte **)&h->repeat_code_len << 0x38 | uVar14;
            h->substate_tree_group = (int)uVar14;
            h->substate_context_map = (int)(uVar14 >> 0x20);
            h->substate_huffman = h->substate_huffman - 8;
            *(long *)&h->symbol = *(long *)&h->symbol + -1;
            *(long *)&h->repeat_code_len = *(long *)&h->repeat_code_len + 1;
          }
          local_c = (uint)(lVar7 != 0);
        } while (local_c != 0);
        local_13c = 0;
LAB_001b5692:
        if (local_13c == 0) {
          (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        (_table_size->header).symbol = result_1 + (_table_size->header).symbol;
      }
      BVar11 = BrotliBuildSimpleHuffmanTable
                         ((HuffmanCode *)opt_table_size_local,8,
                          (_table_size->header).symbols_lists_array,(_table_size->header).symbol);
      if (s_local != (BrotliDecoderStateInternal *)0x0) {
        s_local->state = BVar11;
      }
      (_table_size->header).substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      alphabet_size_limit_local = 1;
    }
  }
  return alphabet_size_limit_local;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size_max,
                                              uint32_t alphabet_size_limit,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliMetablockHeaderArena* h = &s->arena.header;
  /* State machine. */
  for (;;) {
    switch (h->substate_huffman) {
      case BROTLI_STATE_HUFFMAN_NONE:
        if (!BrotliSafeReadBits(br, 2, &h->sub_loop_counter)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        BROTLI_LOG_UINT(h->sub_loop_counter);
        /* The value is used as follows:
           1 for simple code;
           0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
        if (h->sub_loop_counter != 1) {
          h->space = 32;
          h->repeat = 0;  /* num_codes */
          memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo[0]) *
              (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
          memset(&h->code_length_code_lengths[0], 0,
              sizeof(h->code_length_code_lengths));
          h->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          continue;
        }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
        /* Read symbols, codes & code lengths directly. */
        if (!BrotliSafeReadBits(br, 2, &h->symbol)) {  /* num_symbols */
          h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        h->sub_loop_counter = 0;
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
        BrotliDecoderErrorCode result =
            ReadSimpleHuffmanSymbols(alphabet_size_max, alphabet_size_limit, s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
        uint32_t table_size;
        if (h->symbol == 3) {
          uint32_t bits;
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          h->symbol += bits;
        }
        BROTLI_LOG_UINT(h->symbol);
        table_size = BrotliBuildSimpleHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbols_lists_array, h->symbol);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      /* Decode Huffman-coded code lengths. */
      case BROTLI_STATE_HUFFMAN_COMPLEX: {
        uint32_t i;
        BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }
        BrotliBuildCodeLengthsHuffmanTable(h->table,
                                           h->code_length_code_lengths,
                                           h->code_length_histo);
        memset(&h->code_length_histo[0], 0, sizeof(h->code_length_histo));
        for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
          h->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
          h->symbol_lists[h->next_symbol[i]] = 0xFFFF;
        }

        h->symbol = 0;
        h->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
        h->repeat = 0;
        h->repeat_code_len = 0;
        h->space = 32768;
        h->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      }
      /* Fall through. */

      case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
        uint32_t table_size;
        BrotliDecoderErrorCode result = ReadSymbolCodeLengths(
            alphabet_size_limit, s);
        if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
          result = SafeReadSymbolCodeLengths(alphabet_size_limit, s);
        }
        if (result != BROTLI_DECODER_SUCCESS) {
          return result;
        }

        if (h->space != 0) {
          BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", (int)h->space));
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
        }
        table_size = BrotliBuildHuffmanTable(
            table, HUFFMAN_TABLE_BITS, h->symbol_lists, h->code_length_histo);
        if (opt_table_size) {
          *opt_table_size = table_size;
        }
        h->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
        return BROTLI_DECODER_SUCCESS;
      }

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}